

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall rsg::TexLookup::tokenize(TexLookup *this,GeneratorState *state,TokenStream *str)

{
  TokenStream *pTVar1;
  Type TVar2;
  Shader *this_00;
  ProgramParameters *pPVar3;
  char *pcVar4;
  Token local_148;
  Token local_138;
  Token local_128;
  Token local_118;
  Token local_108;
  Token local_f8;
  Token local_e8;
  Token local_d8;
  Token local_c8;
  Token local_b8;
  Token local_a8;
  Token local_98;
  Token local_88;
  Token local_78;
  Token local_68;
  Token local_58 [2];
  Token local_38;
  byte local_21;
  TokenStream *pTStack_20;
  bool isVertex;
  TokenStream *str_local;
  GeneratorState *state_local;
  TexLookup *this_local;
  
  pTStack_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  this_00 = GeneratorState::getShader(state);
  TVar2 = Shader::getType(this_00);
  local_21 = TVar2 == TYPE_VERTEX;
  pPVar3 = GeneratorState::getProgramParameters((GeneratorState *)str_local);
  pTVar1 = pTStack_20;
  if (pPVar3->version == VERSION_300) {
    switch(this->m_type) {
    case TYPE_TEXTURE2D:
      Token::Token(&local_38,"texture");
      TokenStream::operator<<(pTVar1,&local_38);
      Token::~Token(&local_38);
      break;
    case TYPE_TEXTURE2D_LOD:
      pcVar4 = "texture";
      if ((local_21 & 1) != 0) {
        pcVar4 = "textureLod";
      }
      Token::Token(local_58,pcVar4);
      TokenStream::operator<<(pTVar1,local_58);
      Token::~Token(local_58);
      break;
    case TYPE_TEXTURE2D_PROJ:
      Token::Token(&local_68,"textureProj");
      TokenStream::operator<<(pTVar1,&local_68);
      Token::~Token(&local_68);
      break;
    case TYPE_TEXTURE2D_PROJ_LOD:
      pcVar4 = "textureProj";
      if ((local_21 & 1) != 0) {
        pcVar4 = "textureProjLod";
      }
      Token::Token(&local_78,pcVar4);
      TokenStream::operator<<(pTVar1,&local_78);
      Token::~Token(&local_78);
      break;
    case TYPE_TEXTURECUBE:
      Token::Token(&local_88,"texture");
      TokenStream::operator<<(pTVar1,&local_88);
      Token::~Token(&local_88);
      break;
    case TYPE_TEXTURECUBE_LOD:
      pcVar4 = "texture";
      if ((local_21 & 1) != 0) {
        pcVar4 = "textureLod";
      }
      Token::Token(&local_98,pcVar4);
      TokenStream::operator<<(pTVar1,&local_98);
      Token::~Token(&local_98);
    }
  }
  else {
    switch(this->m_type) {
    case TYPE_TEXTURE2D:
      Token::Token(&local_a8,"texture2D");
      TokenStream::operator<<(pTVar1,&local_a8);
      Token::~Token(&local_a8);
      break;
    case TYPE_TEXTURE2D_LOD:
      pcVar4 = "texture2D";
      if ((local_21 & 1) != 0) {
        pcVar4 = "texture2DLod";
      }
      Token::Token(&local_b8,pcVar4);
      TokenStream::operator<<(pTVar1,&local_b8);
      Token::~Token(&local_b8);
      break;
    case TYPE_TEXTURE2D_PROJ:
      Token::Token(&local_c8,"texture2DProj");
      TokenStream::operator<<(pTVar1,&local_c8);
      Token::~Token(&local_c8);
      break;
    case TYPE_TEXTURE2D_PROJ_LOD:
      pcVar4 = "texture2DProj";
      if ((local_21 & 1) != 0) {
        pcVar4 = "texture2DProjLod";
      }
      Token::Token(&local_d8,pcVar4);
      TokenStream::operator<<(pTVar1,&local_d8);
      Token::~Token(&local_d8);
      break;
    case TYPE_TEXTURECUBE:
      Token::Token(&local_e8,"textureCube");
      TokenStream::operator<<(pTVar1,&local_e8);
      Token::~Token(&local_e8);
      break;
    case TYPE_TEXTURECUBE_LOD:
      pcVar4 = "textureCube";
      if ((local_21 & 1) != 0) {
        pcVar4 = "textureCubeLod";
      }
      Token::Token(&local_f8,pcVar4);
      TokenStream::operator<<(pTVar1,&local_f8);
      Token::~Token(&local_f8);
    }
  }
  pTVar1 = pTStack_20;
  Token::Token(&local_108,LEFT_PAREN);
  TokenStream::operator<<(pTVar1,&local_108);
  Token::~Token(&local_108);
  pTVar1 = pTStack_20;
  pcVar4 = rsg::Variable::getName(this->m_sampler);
  Token::Token(&local_118,pcVar4);
  TokenStream::operator<<(pTVar1,&local_118);
  Token::~Token(&local_118);
  pTVar1 = pTStack_20;
  Token::Token(&local_128,COMMA);
  TokenStream::operator<<(pTVar1,&local_128);
  Token::~Token(&local_128);
  (*this->m_coordExpr->_vptr_Expression[3])(this->m_coordExpr,str_local,pTStack_20);
  pTVar1 = pTStack_20;
  if (this->m_lodBiasExpr != (Expression *)0x0) {
    Token::Token(&local_138,COMMA);
    TokenStream::operator<<(pTVar1,&local_138);
    Token::~Token(&local_138);
    (*this->m_lodBiasExpr->_vptr_Expression[3])(this->m_lodBiasExpr,str_local,pTStack_20);
  }
  pTVar1 = pTStack_20;
  Token::Token(&local_148,RIGHT_PAREN);
  TokenStream::operator<<(pTVar1,&local_148);
  Token::~Token(&local_148);
  return;
}

Assistant:

void TexLookup::tokenize (GeneratorState& state, TokenStream& str) const
{
	bool isVertex = state.getShader().getType() == Shader::TYPE_VERTEX;

	if (state.getProgramParameters().version == VERSION_300)
	{
		switch (m_type)
		{
			case TYPE_TEXTURE2D:			str << "texture";										break;
			case TYPE_TEXTURE2D_LOD:		str << (isVertex ? "textureLod" : "texture");			break;
			case TYPE_TEXTURE2D_PROJ:		str << "textureProj";									break;
			case TYPE_TEXTURE2D_PROJ_LOD:	str << (isVertex ? "textureProjLod" : "textureProj");	break;
			case TYPE_TEXTURECUBE:			str << "texture";										break;
			case TYPE_TEXTURECUBE_LOD:		str << (isVertex ? "textureLod" : "texture");			break;
			default:
				DE_ASSERT(DE_FALSE);
		}
	}
	else
	{
		switch (m_type)
		{
			case TYPE_TEXTURE2D:			str << "texture2D";											break;
			case TYPE_TEXTURE2D_LOD:		str << (isVertex ? "texture2DLod" : "texture2D");			break;
			case TYPE_TEXTURE2D_PROJ:		str << "texture2DProj";										break;
			case TYPE_TEXTURE2D_PROJ_LOD:	str << (isVertex ? "texture2DProjLod" : "texture2DProj");	break;
			case TYPE_TEXTURECUBE:			str << "textureCube";										break;
			case TYPE_TEXTURECUBE_LOD:		str << (isVertex ? "textureCubeLod" : "textureCube");		break;
			default:
				DE_ASSERT(DE_FALSE);
		}
	}

	str << Token::LEFT_PAREN;
	str << m_sampler->getName();
	str << Token::COMMA;
	m_coordExpr->tokenize(state, str);

	if (m_lodBiasExpr)
	{
		str << Token::COMMA;
		m_lodBiasExpr->tokenize(state, str);
	}

	str << Token::RIGHT_PAREN;
}